

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

void __thiscall
slang::TypedBumpAllocator<slang::analysis::AnalyzedScope>::~TypedBumpAllocator
          (TypedBumpAllocator<slang::analysis::AnalyzedScope> *this)

{
  byte *p;
  Segment *pSVar1;
  Segment *this_00;
  Segment *pSVar2;
  
  for (pSVar2 = (this->super_BumpAllocator).head; pSVar2 != (Segment *)0x0; pSVar2 = pSVar2->prev) {
    if (pSVar2 + 1 != (Segment *)pSVar2->current) {
      this_00 = pSVar2 + 3;
      do {
        std::
        vector<slang::analysis::AnalyzedProcedure,_std::allocator<slang::analysis::AnalyzedProcedure>_>
        ::~vector((vector<slang::analysis::AnalyzedProcedure,_std::allocator<slang::analysis::AnalyzedProcedure>_>
                   *)this_00);
        p = this_00[-2].current;
        if (p != (byte *)0x0) {
          operator_delete(p,(long)this_00[-1].current - (long)p);
        }
        pSVar1 = this_00 + 1;
        this_00 = (Segment *)&this_00[3].current;
      } while (&pSVar1->current != (byte **)pSVar2->current);
    }
  }
  BumpAllocator::~BumpAllocator(&this->super_BumpAllocator);
  return;
}

Assistant:

~TypedBumpAllocator() {
        Segment* seg = head;
        while (seg) {
            for (T* cur = (T*)(seg + 1); cur != (T*)seg->current; cur++)
                cur->~T();
            seg = seg->prev;
        }
    }